

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O0

ssize_t __thiscall SystemCatalog::write(SystemCatalog *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined7 extraout_var;
  reference ptVar2;
  ulong uVar3;
  size_t __n_00;
  undefined1 auVar4 [16];
  size_t local_a0;
  undefined8 local_98;
  undefined1 local_90 [8];
  type k;
  iterator __end1;
  iterator __begin1;
  set<type,_std::less<type>,_std::allocator<type>_> *__range1;
  __mbstate_t local_18;
  SystemCatalog *local_10;
  SystemCatalog *this_local;
  
  local_10 = this;
  writeNumTypes(this);
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&__range1,4);
  std::ostream::seekp(&this->field_0x48,__range1,local_18);
  __end1 = std::set<type,_std::less<type>,_std::allocator<type>_>::begin(&this->types);
  k.dir = (directory *)std::set<type,_std::less<type>,_std::allocator<type>_>::end(&this->types);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&k.dir);
    if (!bVar1) break;
    ptVar2 = std::_Rb_tree_const_iterator<type>::operator*(&__end1);
    type::type((type *)local_90,ptVar2);
    auVar4 = std::ostream::tellp();
    local_98 = auVar4._8_8_;
    __n_00 = auVar4._0_8_;
    local_a0 = __n_00;
    uVar3 = std::fpos::operator_cast_to_long((fpos *)&local_a0);
    type::write((type *)local_90,(int)this + 0x38,(void *)(uVar3 & 0xffffffff),__n_00);
    type::~type((type *)local_90);
    std::_Rb_tree_const_iterator<type>::operator++(&__end1);
  }
  return CONCAT71(extraout_var,bVar1);
}

Assistant:

void SystemCatalog::write() {

    writeNumTypes();

    catalogFile.seekp(NUM_TYPES);

    for (auto k: types) {
        k.write(catalogFile, (int) catalogFile.tellp());
    }
}